

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

int Ivy_FastMapDelay(Ivy_Man_t *pAig)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  
  lVar2 = (long)pAig->vPos->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    iVar1 = 0;
    do {
      piVar5 = (int *)(*(ulong *)((long)pAig->vPos->pArray[lVar3] + 0x10) & 0xfffffffffffffffe);
      if (0xfffffffd < (piVar5[2] & 0xfU) - 7) {
        iVar4 = (int)*(short *)(*(long *)((long)pAig->pData + 0x10) + 8 +
                               (long)*(int *)((long)pAig->pData + 8) * (long)*piVar5);
        if (iVar1 <= iVar4) {
          iVar1 = iVar4;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

int Ivy_FastMapDelay( Ivy_Man_t * pAig )
{
    Ivy_Supp_t * pSupp;
    Ivy_Obj_t * pObj;
    int i, DelayMax = 0;
    Ivy_ManForEachPo( pAig, pObj, i )
    {
        pObj = Ivy_ObjFanin0(pObj);
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pSupp = Ivy_ObjSupp( pAig, pObj );
        if ( DelayMax < pSupp->Delay )
            DelayMax = pSupp->Delay;
    }
    return DelayMax;
}